

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

void __thiscall
Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
          (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this,
          DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *obj)

{
  uint *puVar1;
  TermList *pTVar2;
  bool bVar3;
  IteratorBase local_28;
  
  this->_timestamp = 1;
  this->_size = 0;
  this->_deleted = 0;
  this->_capacityIndex = 0;
  this->_capacity = 0;
  *(undefined8 *)&this->_nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&this->_entries + 4) = 0;
  *(undefined4 *)((long)&this->_afterLast + 4) = 0;
  local_28._next = obj->_entries;
  local_28._last = obj->_afterLast;
  local_28._timestamp = obj->_timestamp;
  while( true ) {
    bVar3 = IteratorBase::hasNext(&local_28);
    if (!bVar3) break;
    puVar1 = &(local_28._next)->_key;
    pTVar2 = &(local_28._next)->_val;
    local_28._next = local_28._next + 1;
    insert(this,*puVar1,(TermList)pTVar2->_content);
  }
  return;
}

Assistant:

DHMap(const DHMap& obj)
  : _timestamp(1), _size(0), _deleted(0), _capacityIndex(0), _capacity(0),
  _nextExpansionOccupancy(0), _entries(0), _afterLast(0)
  {
    typename DHMap::IteratorBase iit(obj);
    while(iit.hasNext()) {
      auto e = iit.next();
      ALWAYS(insert(e->_key,e->_val));
    }
  }